

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void fallbackQSort3(UInt32 *fmap,UInt32 *eclass,Int32 loSt,Int32 hiSt)

{
  int lo_00;
  int hi_00;
  UInt32 UVar1;
  Int32 IVar2;
  int iVar3;
  int iVar4;
  int local_3ac;
  int local_3a8;
  int local_3a0;
  Int32 zztmp_4;
  Int32 yyn_1;
  Int32 yyp2_1;
  Int32 yyp1_1;
  Int32 zztmp_3;
  Int32 yyn;
  Int32 yyp2;
  Int32 yyp1;
  Int32 zztmp_2;
  Int32 zztmp_1;
  Int32 zztmp;
  Int32 stackHi [100];
  Int32 stackLo [100];
  uint local_4c;
  UInt32 r3;
  UInt32 r;
  UInt32 med;
  Int32 hi;
  Int32 lo;
  Int32 sp;
  Int32 m;
  Int32 n;
  Int32 gtHi;
  Int32 ltLo;
  Int32 unHi;
  Int32 unLo;
  Int32 hiSt_local;
  Int32 loSt_local;
  UInt32 *eclass_local;
  UInt32 *fmap_local;
  
  local_4c = 0;
  stackHi[0x62] = loSt;
  zztmp_1 = hiSt;
  IVar2 = 1;
  do {
    while( true ) {
      hi = IVar2;
      if (hi < 1) {
        return;
      }
      if (0x62 < hi) {
        BZ2_bz__AssertH__fail(0x3ec);
      }
      IVar2 = hi + -1;
      lo_00 = stackHi[(long)IVar2 + 0x62];
      hi_00 = (&zztmp_1)[IVar2];
      if (9 < hi_00 - lo_00) break;
      fallbackSimpleSort(fmap,eclass,lo_00,hi_00);
    }
    local_4c = local_4c * 0x1dc5 + 1 & 0x7fff;
    n = lo_00;
    ltLo = lo_00;
    gtHi = hi_00;
    m = hi_00;
    if (local_4c % 3 == 0) {
      r3 = eclass[fmap[lo_00]];
    }
    else if (local_4c % 3 == 1) {
      r3 = eclass[fmap[lo_00 + hi_00 >> 1]];
    }
    else {
      r3 = eclass[fmap[hi_00]];
    }
LAB_00223278:
    while (ltLo <= gtHi) {
      if (eclass[fmap[ltLo]] == r3) {
        UVar1 = fmap[ltLo];
        fmap[ltLo] = fmap[n];
        fmap[n] = UVar1;
        n = n + 1;
        ltLo = ltLo + 1;
      }
      else {
        if (0 < (int)(eclass[fmap[ltLo]] - r3)) break;
        ltLo = ltLo + 1;
      }
    }
    while (ltLo <= gtHi) {
      if (eclass[fmap[gtHi]] == r3) {
        UVar1 = fmap[gtHi];
        fmap[gtHi] = fmap[m];
        fmap[m] = UVar1;
        m = m + -1;
        gtHi = gtHi + -1;
      }
      else {
        if ((int)(eclass[fmap[gtHi]] - r3) < 0) break;
        gtHi = gtHi + -1;
      }
    }
    if (ltLo <= gtHi) {
      UVar1 = fmap[ltLo];
      fmap[ltLo] = fmap[gtHi];
      fmap[gtHi] = UVar1;
      ltLo = ltLo + 1;
      gtHi = gtHi + -1;
      goto LAB_00223278;
    }
    if (n <= m) {
      if (n - lo_00 < ltLo - n) {
        local_3a8 = n - lo_00;
      }
      else {
        local_3a8 = ltLo - n;
      }
      zztmp_3 = ltLo - local_3a8;
      yyn = lo_00;
      for (yyp1_1 = local_3a8; 0 < yyp1_1; yyp1_1 = yyp1_1 + -1) {
        UVar1 = fmap[yyn];
        fmap[yyn] = fmap[zztmp_3];
        fmap[zztmp_3] = UVar1;
        yyn = yyn + 1;
        zztmp_3 = zztmp_3 + 1;
      }
      if (hi_00 - m < m - gtHi) {
        local_3ac = hi_00 - m;
      }
      else {
        local_3ac = m - gtHi;
      }
      yyn_1 = ltLo;
      zztmp_4 = hi_00 - local_3ac;
      for (local_3a0 = local_3ac; zztmp_4 = zztmp_4 + 1, 0 < local_3a0; local_3a0 = local_3a0 + -1)
      {
        UVar1 = fmap[yyn_1];
        fmap[yyn_1] = fmap[zztmp_4];
        fmap[zztmp_4] = UVar1;
        yyn_1 = yyn_1 + 1;
      }
      iVar3 = ((lo_00 + ltLo) - n) + -1;
      iVar4 = (hi_00 - (m - gtHi)) + 1;
      if (hi_00 - iVar4 < iVar3 - lo_00) {
        stackHi[(long)IVar2 + 0x62] = lo_00;
        (&zztmp_1)[IVar2] = iVar3;
        stackHi[(long)hi + 0x62] = iVar4;
        (&zztmp_1)[hi] = hi_00;
      }
      else {
        stackHi[(long)IVar2 + 0x62] = iVar4;
        (&zztmp_1)[IVar2] = hi_00;
        stackHi[(long)hi + 0x62] = lo_00;
        (&zztmp_1)[hi] = iVar3;
      }
      hi = hi + 1;
      IVar2 = hi;
    }
  } while( true );
}

Assistant:

static
void fallbackQSort3 ( UInt32* fmap, 
                      UInt32* eclass,
                      Int32   loSt, 
                      Int32   hiSt )
{
   Int32 unLo, unHi, ltLo, gtHi, n, m;
   Int32 sp, lo, hi;
   UInt32 med, r, r3;
   Int32 stackLo[FALLBACK_QSORT_STACK_SIZE];
   Int32 stackHi[FALLBACK_QSORT_STACK_SIZE];

   r = 0;

   sp = 0;
   fpush ( loSt, hiSt );

   while (sp > 0) {

      AssertH ( sp < FALLBACK_QSORT_STACK_SIZE - 1, 1004 );

      fpop ( lo, hi );
      if (hi - lo < FALLBACK_QSORT_SMALL_THRESH) {
         fallbackSimpleSort ( fmap, eclass, lo, hi );
         continue;
      }

      /* Random partitioning.  Median of 3 sometimes fails to
         avoid bad cases.  Median of 9 seems to help but 
         looks rather expensive.  This too seems to work but
         is cheaper.  Guidance for the magic constants 
         7621 and 32768 is taken from Sedgewick's algorithms
         book, chapter 35.
      */
      r = ((r * 7621) + 1) % 32768;
      r3 = r % 3;
      if (r3 == 0) med = eclass[fmap[lo]]; else
      if (r3 == 1) med = eclass[fmap[(lo+hi)>>1]]; else
                   med = eclass[fmap[hi]];

      unLo = ltLo = lo;
      unHi = gtHi = hi;

      while (1) {
         while (1) {
            if (unLo > unHi) break;
            n = (Int32)eclass[fmap[unLo]] - (Int32)med;
            if (n == 0) { 
               fswap(fmap[unLo], fmap[ltLo]); 
               ltLo++; unLo++; 
               continue; 
            };
            if (n > 0) break;
            unLo++;
         }
         while (1) {
            if (unLo > unHi) break;
            n = (Int32)eclass[fmap[unHi]] - (Int32)med;
            if (n == 0) { 
               fswap(fmap[unHi], fmap[gtHi]); 
               gtHi--; unHi--; 
               continue; 
            };
            if (n < 0) break;
            unHi--;
         }
         if (unLo > unHi) break;
         fswap(fmap[unLo], fmap[unHi]); unLo++; unHi--;
      }

      AssertD ( unHi == unLo-1, "fallbackQSort3(2)" );

      if (gtHi < ltLo) continue;

      n = fmin(ltLo-lo, unLo-ltLo); fvswap(lo, unLo-n, n);
      m = fmin(hi-gtHi, gtHi-unHi); fvswap(unLo, hi-m+1, m);

      n = lo + unLo - ltLo - 1;
      m = hi - (gtHi - unHi) + 1;

      if (n - lo > hi - m) {
         fpush ( lo, n );
         fpush ( m, hi );
      } else {
         fpush ( m, hi );
         fpush ( lo, n );
      }
   }
}